

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stat_mgr.cxx
# Opt level: O0

stat_elem * __thiscall nuraft::stat_mgr::get_stat(stat_mgr *this,string *stat_name)

{
  bool bVar1;
  pointer ppVar2;
  unique_lock<std::mutex> *in_RDI;
  iterator entry;
  unique_lock<std::mutex> l;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nuraft::stat_elem_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nuraft::stat_elem_*>_>_>
  *in_stack_ffffffffffffff98;
  _Self local_48 [3];
  _Self local_30 [5];
  stat_elem *local_8;
  
  std::unique_lock<std::mutex>::unique_lock(in_RDI,(mutex_type *)in_stack_ffffffffffffff98);
  local_30[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nuraft::stat_elem_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nuraft::stat_elem_*>_>_>
       ::find(in_stack_ffffffffffffff98,(key_type *)0x2c4405);
  local_48[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nuraft::stat_elem_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nuraft::stat_elem_*>_>_>
       ::end(in_stack_ffffffffffffff98);
  bVar1 = std::operator==(local_30,local_48);
  if (bVar1) {
    local_8 = (stat_elem *)0x0;
  }
  else {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nuraft::stat_elem_*>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nuraft::stat_elem_*>_>
                           *)0x2c4475);
    local_8 = ppVar2->second;
  }
  std::unique_lock<std::mutex>::~unique_lock(in_RDI);
  return local_8;
}

Assistant:

stat_elem* stat_mgr::get_stat(const std::string& stat_name) {
    std::unique_lock<std::mutex> l(stat_map_lock_);
    auto entry = stat_map_.find(stat_name);
    if (entry == stat_map_.end()) {
        // Not exist.
        return nullptr;
    }
    return entry->second;
}